

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void secp256k1_write_be64(uchar *p,uint64_t x)

{
  *(uint64_t *)p =
       x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
       (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
       (x & 0xff00) << 0x28 | x << 0x38;
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_write_be64(unsigned char* p, uint64_t x) {
    p[7] = x;
    p[6] = x >>  8;
    p[5] = x >> 16;
    p[4] = x >> 24;
    p[3] = x >> 32;
    p[2] = x >> 40;
    p[1] = x >> 48;
    p[0] = x >> 56;
}